

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_binder.cpp
# Opt level: O2

BindResult * __thiscall
duckdb::AggregateBinder::BindExpression
          (BindResult *__return_storage_ptr__,AggregateBinder *this,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *expr_ptr,idx_t depth,bool root_expression)

{
  type expr;
  BinderException *__return_storage_ptr___00;
  allocator local_51;
  string local_50;
  
  expr = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
         operator*(expr_ptr);
  if ((expr->super_BaseExpression).expression_class != WINDOW) {
    ExpressionBinder::BindExpression
              (__return_storage_ptr__,&this->super_ExpressionBinder,expr_ptr,depth,false);
    return __return_storage_ptr__;
  }
  __return_storage_ptr___00 = (BinderException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_50,"aggregate function calls cannot contain window function calls",
             &local_51);
  BinderException::Unsupported(__return_storage_ptr___00,expr,&local_50);
  __cxa_throw(__return_storage_ptr___00,&BinderException::typeinfo,
              ::std::runtime_error::~runtime_error);
}

Assistant:

BindResult AggregateBinder::BindExpression(unique_ptr<ParsedExpression> &expr_ptr, idx_t depth, bool root_expression) {
	auto &expr = *expr_ptr;
	switch (expr.GetExpressionClass()) {
	case ExpressionClass::WINDOW:
		throw BinderException::Unsupported(expr, "aggregate function calls cannot contain window function calls");
	default:
		return ExpressionBinder::BindExpression(expr_ptr, depth);
	}
}